

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::log_internal::Encode64Bit
          (log_internal *this,uint64_t tag,uint64_t value,Span<char> *buf)

{
  undefined1 *puVar1;
  Span<char> *pSVar2;
  anon_unknown_4 *this_00;
  undefined1 *puVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  Span<char> *pSVar7;
  Span<char> *pSVar8;
  Span<char> *buf_00;
  Span<char> *pSVar9;
  Span<char> *pSVar10;
  size_type *psVar11;
  undefined1 *puVar12;
  Span<char> *pSVar13;
  size_type sVar14;
  anon_unknown_4 *paVar15;
  long *size;
  Span<char> *this_01;
  Span<char> *extraout_RDX;
  undefined8 *size_00;
  ulong uVar16;
  uint64_t uVar17;
  Span<char> *__src;
  Span<char> *pSVar18;
  pointer __dest;
  undefined1 uVar19;
  uint64_t uVar20;
  Span<char> *this_02;
  
  pSVar13 = (Span<char> *)((long)this * 8 + 1);
  uVar17 = 1;
  pSVar8 = pSVar13;
  if (0x7f < (ulong)((long)this << 3)) {
    do {
      buf = (Span<char> *)((ulong)pSVar8 >> 7);
      uVar17 = uVar17 + 1;
      bVar4 = (Span<char> *)0x3fff < pSVar8;
      pSVar8 = buf;
    } while (bVar4);
  }
  uVar16 = uVar17 + 8;
  uVar6 = *(ulong *)(value + 8);
  if (uVar6 < uVar16) {
    psVar11 = (size_type *)0x0;
  }
  else {
    anon_unknown_4::EncodeRawVarint((anon_unknown_4 *)pSVar13,uVar17,value,buf);
    uVar5 = 0;
    do {
      if (*(ulong *)(value + 8) <= uVar5) {
        Encode64Bit();
        goto LAB_002abafb;
      }
      buf = *(Span<char> **)value;
      *(char *)((long)&buf->ptr_ + uVar5) = (char)tag;
      tag = tag >> 8;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 8);
    buf = *(Span<char> **)(value + 8);
    if (buf < (Span<char> *)0x8) {
LAB_002abafb:
      Encode64Bit();
      uVar16 = uVar17 & 0xffffffff;
      pSVar8 = (Span<char> *)((long)pSVar13 * 8 + 5);
      __src = (Span<char> *)0x1;
      pSVar18 = pSVar8;
      if (0x7f < (ulong)((long)pSVar13 << 3)) {
        do {
          buf = (Span<char> *)((ulong)pSVar18 >> 7);
          __src = (Span<char> *)((long)&__src->ptr_ + 1);
          bVar4 = (Span<char> *)0x3fff < pSVar18;
          pSVar18 = buf;
        } while (bVar4);
      }
      puVar1 = (undefined1 *)((long)&__src->ptr_ + 4);
      puVar3 = (undefined1 *)size[1];
      if (puVar3 < puVar1) {
        puVar12 = (undefined1 *)0x0;
      }
      else {
        anon_unknown_4::EncodeRawVarint((anon_unknown_4 *)pSVar8,(uint64_t)__src,(size_t)size,buf);
        uVar6 = 0;
        do {
          if ((ulong)size[1] <= uVar6) {
            Encode32Bit();
            goto LAB_002abba1;
          }
          buf = (Span<char> *)*size;
          *(char *)((long)&buf->ptr_ + uVar6) = (char)uVar16;
          uVar16 = uVar16 >> 8;
          uVar6 = uVar6 + 1;
        } while (uVar6 != 4);
        buf = (Span<char> *)size[1];
        if (buf < (Span<char> *)0x4) {
LAB_002abba1:
          Encode32Bit();
          pSVar13 = (Span<char> *)((long)pSVar8 * 8 + 2);
          uVar20 = 1;
          uVar17 = 1;
          pSVar18 = pSVar13;
          pSVar7 = buf;
          if (0x7f < (ulong)((long)pSVar8 << 3)) {
            do {
              pSVar7 = (Span<char> *)((ulong)pSVar18 >> 7);
              uVar17 = uVar17 + 1;
              bVar4 = (Span<char> *)0x3fff < pSVar18;
              pSVar18 = pSVar7;
            } while (bVar4);
          }
          if ((Span<char> *)0x7f < this_01) {
            uVar20 = 1;
            pSVar8 = this_01;
            do {
              pSVar7 = (Span<char> *)((ulong)pSVar8 >> 7);
              uVar20 = uVar20 + 1;
              bVar4 = (Span<char> *)0x3fff < pSVar8;
              pSVar8 = pSVar7;
            } while (bVar4);
          }
          uVar6 = (long)&this_01->ptr_ + uVar20 + uVar17;
          uVar16 = buf->len_;
          if (uVar16 < uVar6) {
            pSVar13 = (Span<char> *)0x0;
          }
          else {
            anon_unknown_4::EncodeRawVarint((anon_unknown_4 *)pSVar13,uVar17,(size_t)buf,pSVar7);
            anon_unknown_4::EncodeRawVarint((anon_unknown_4 *)this_01,uVar20,(size_t)buf,pSVar7);
            __dest = buf->ptr_;
            memcpy(__dest,__src,(size_t)this_01);
            pSVar13 = (Span<char> *)((long)buf->len_ - (long)this_01);
            if ((Span<char> *)buf->len_ < this_01) {
              EncodeBytes();
              pSVar8 = (Span<char> *)((long)__dest * 8 + 2);
              uVar17 = 1;
              pSVar18 = (Span<char> *)0x1;
              pSVar7 = pSVar8;
              buf_00 = pSVar13;
              if (0x7f < (ulong)((long)__dest << 3)) {
                do {
                  buf_00 = (Span<char> *)((ulong)pSVar7 >> 7);
                  pSVar18 = (Span<char> *)((long)&pSVar18->ptr_ + 1);
                  bVar4 = (Span<char> *)0x3fff < pSVar7;
                  pSVar7 = buf_00;
                } while (bVar4);
              }
              pSVar7 = (Span<char> *)pSVar13->len_;
              pSVar9 = extraout_RDX;
              if (pSVar7 < extraout_RDX) {
                pSVar9 = pSVar7;
              }
              if ((Span<char> *)0x7f < pSVar9) {
                uVar17 = 1;
                do {
                  buf_00 = (Span<char> *)((ulong)pSVar9 >> 7);
                  uVar17 = uVar17 + 1;
                  bVar4 = (Span<char> *)0x3fff < pSVar9;
                  pSVar9 = buf_00;
                } while (bVar4);
              }
              pSVar9 = (Span<char> *)((long)&pSVar18->ptr_ + uVar17);
              this_02 = extraout_RDX;
              if (((pSVar9 <= pSVar7) &&
                  (pSVar2 = (Span<char> *)((long)&pSVar9->ptr_ + (long)&extraout_RDX->ptr_),
                  pSVar10 = (Span<char> *)((long)pSVar2 - (long)pSVar7),
                  pSVar7 <= pSVar2 && pSVar10 != (Span<char> *)0x0)) &&
                 (this_02 = (Span<char> *)((long)extraout_RDX - (long)pSVar10),
                 extraout_RDX < pSVar10)) {
LAB_002abd70:
                EncodeBytesTruncate();
                this_00 = (anon_unknown_4 *)((long)pSVar8 * 8 + 2);
                uVar20 = 1;
                uVar17 = 1;
                paVar15 = this_00;
                if (0x7f < (ulong)((long)pSVar8 << 3)) {
                  do {
                    uVar17 = uVar17 + 1;
                    bVar4 = (anon_unknown_4 *)0x3fff < paVar15;
                    paVar15 = (anon_unknown_4 *)((ulong)paVar15 >> 7);
                  } while (bVar4);
                }
                pSVar13 = (Span<char> *)size_00[1];
                if (pSVar13 < pSVar18) {
                  pSVar18 = pSVar13;
                }
                if ((Span<char> *)0x7f < pSVar18) {
                  uVar20 = 1;
                  do {
                    uVar20 = uVar20 + 1;
                    bVar4 = (Span<char> *)0x3fff < pSVar18;
                    pSVar18 = (Span<char> *)((ulong)pSVar18 >> 7);
                  } while (bVar4);
                }
                if (pSVar13 < (Span<char> *)(uVar20 + uVar17)) {
                  size_00[1] = 0;
                  uVar19 = 0;
                }
                else {
                  anon_unknown_4::EncodeRawVarint(this_00,uVar17,(size_t)size_00,pSVar13);
                  uVar19 = (undefined1)*size_00;
                  anon_unknown_4::EncodeRawVarint
                            ((anon_unknown_4 *)0x0,uVar20,(size_t)size_00,pSVar13);
                }
                return (bool)uVar19;
              }
              pSVar9 = (Span<char> *)((long)&this_02->ptr_ + (long)&pSVar9->ptr_);
              if (pSVar7 < pSVar9) {
                sVar14 = 0;
              }
              else {
                anon_unknown_4::EncodeRawVarint
                          ((anon_unknown_4 *)pSVar8,(uint64_t)pSVar18,(size_t)pSVar13,buf_00);
                anon_unknown_4::EncodeRawVarint
                          ((anon_unknown_4 *)this_02,uVar17,(size_t)pSVar13,buf_00);
                pSVar8 = (Span<char> *)pSVar13->ptr_;
                memcpy(pSVar8,__src,(size_t)this_02);
                sVar14 = (long)pSVar13->len_ - (long)this_02;
                if ((Span<char> *)pSVar13->len_ < this_02) {
                  EncodeBytesTruncate();
                  pSVar18 = __src;
                  goto LAB_002abd70;
                }
                pSVar13->ptr_ = (pointer)((long)&this_02->ptr_ + (long)pSVar13->ptr_);
              }
              pSVar13->len_ = sVar14;
              return pSVar9 <= pSVar7;
            }
            buf->ptr_ = (pointer)((long)&this_01->ptr_ + (long)buf->ptr_);
          }
          buf->len_ = (size_type)pSVar13;
          return uVar6 <= uVar16;
        }
        *size = *size + 4;
        puVar12 = (undefined1 *)((long)&buf[-1].len_ + 4);
      }
      size[1] = (long)puVar12;
      return puVar1 <= puVar3;
    }
    *(long *)value = *(long *)value + 8;
    psVar11 = &buf[-1].len_;
  }
  *(size_type **)(value + 8) = psVar11;
  return uVar16 <= uVar6;
}

Assistant:

bool Encode64Bit(uint64_t tag, uint64_t value, absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::k64Bit);
  const size_t tag_type_size = VarintSize(tag_type);
  if (tag_type_size + sizeof(value) > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  for (size_t s = 0; s < sizeof(value); s++) {
    (*buf)[s] = static_cast<char>(value & 0xff);
    value >>= 8;
  }
  buf->remove_prefix(sizeof(value));
  return true;
}